

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O2

DOMDocumentFragment * __thiscall
xercesc_4_0::DOMRangeImpl::traverseCommonAncestors
          (DOMRangeImpl *this,DOMNode *startAncestor,DOMNode *endAncestor,int how)

{
  int iVar1;
  DOMDocumentFragment *pDVar2;
  DOMNode *pDVar3;
  undefined4 extraout_var_00;
  XMLSize_t XVar4;
  XMLSize_t XVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DOMRangeImpl *pDVar6;
  DOMRangeImpl *this_00;
  int iVar7;
  undefined4 extraout_var;
  
  if (how == 3) {
    pDVar2 = (DOMDocumentFragment *)0x0;
  }
  else {
    iVar1 = (*(this->fDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[4])();
    pDVar2 = (DOMDocumentFragment *)CONCAT44(extraout_var,iVar1);
  }
  pDVar3 = traverseLeftBoundary(this,startAncestor,how);
  if (pDVar2 != (DOMDocumentFragment *)0x0) {
    (*(pDVar2->super_DOMNode)._vptr_DOMNode[0x11])(pDVar2,pDVar3);
  }
  pDVar6 = (DOMRangeImpl *)startAncestor;
  iVar1 = (*startAncestor->_vptr_DOMNode[5])();
  XVar4 = indexOf(pDVar6,startAncestor,(DOMNode *)CONCAT44(extraout_var_00,iVar1));
  XVar5 = indexOf(pDVar6,endAncestor,(DOMNode *)CONCAT44(extraout_var_00,iVar1));
  iVar1 = (*startAncestor->_vptr_DOMNode[10])(startAncestor);
  pDVar6 = (DOMRangeImpl *)CONCAT44(extraout_var_01,iVar1);
  for (iVar7 = ~(uint)XVar4 + (int)XVar5; 0 < iVar7; iVar7 = iVar7 + -1) {
    this_00 = pDVar6;
    iVar1 = (*(pDVar6->super_DOMRange)._vptr_DOMRange[10])();
    pDVar3 = traverseFullySelected(this_00,(DOMNode *)pDVar6,how);
    if (pDVar2 != (DOMDocumentFragment *)0x0) {
      (*(pDVar2->super_DOMNode)._vptr_DOMNode[0x11])(pDVar2,pDVar3);
    }
    pDVar6 = (DOMRangeImpl *)CONCAT44(extraout_var_02,iVar1);
  }
  pDVar3 = traverseRightBoundary(this,endAncestor,how);
  if (pDVar2 != (DOMDocumentFragment *)0x0) {
    (*(pDVar2->super_DOMNode)._vptr_DOMNode[0x11])(pDVar2,pDVar3);
  }
  if (how != 2) {
    (*(this->super_DOMRange)._vptr_DOMRange[0xb])(this,startAncestor);
    (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,1);
  }
  return pDVar2;
}

Assistant:

DOMDocumentFragment* DOMRangeImpl::traverseCommonAncestors( DOMNode*startAncestor, DOMNode*endAncestor, int how )
{
    DOMDocumentFragment* frag = 0;
    if ( how!=DELETE_CONTENTS)
        frag = fDocument->createDocumentFragment();

    DOMNode*n = traverseLeftBoundary( startAncestor, how );
    if ( frag!=0 )
        frag->appendChild( n );

    DOMNode*commonParent = startAncestor->getParentNode();
    XMLSize_t startOffset = indexOf( startAncestor, commonParent );
    XMLSize_t endOffset = indexOf( endAncestor, commonParent );
    ++startOffset;

    int cnt = (int)endOffset - (int)startOffset;
    DOMNode* sibling = startAncestor->getNextSibling();

    while( cnt > 0 )
    {
        DOMNode* nextSibling = sibling->getNextSibling();
        n = traverseFullySelected( sibling, how );
        if ( frag!=0 )
            frag->appendChild( n );
        sibling = nextSibling;
        --cnt;
    }

    n = traverseRightBoundary( endAncestor, how );
    if ( frag!=0 )
        frag->appendChild( n );

    if ( how != CLONE_CONTENTS )
    {
        setStartAfter( startAncestor );
        collapse( true );
    }
    return frag;
}